

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void lex_next(Lexer *lxr)

{
  Lexer *lxr_local;
  
  (lxr->tk).line = lxr->line;
  (lxr->tk).start = lxr->cursor;
  (lxr->tk).field_4.num = 0.0;
  switch(lxr->code[lxr->cursor]) {
  case '\0':
    (lxr->tk).type = 0x119;
    (lxr->tk).length = 0;
    return;
  default:
    goto switchD_0011d52d_caseD_1;
  case '\t':
  case '\n':
  case '\r':
  case ' ':
    lex_whitespace(lxr);
    lex_next(lxr);
    return;
  case '!':
    goto switchD_0011d52d_caseD_21;
  case '%':
    goto switchD_0011d52d_caseD_25;
  case '&':
    goto switchD_0011d52d_caseD_26;
  case '*':
    goto switchD_0011d52d_caseD_2a;
  case '+':
    goto switchD_0011d52d_caseD_2b;
  case '-':
    goto switchD_0011d52d_caseD_2d;
  case '.':
    break;
  case '/':
    goto switchD_0011d52d_caseD_2f;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    lex_num(lxr);
    return;
  case '<':
    goto switchD_0011d52d_caseD_3c;
  case '=':
    goto switchD_0011d52d_caseD_3d;
  case '>':
    goto switchD_0011d52d_caseD_3e;
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case '_':
  case 'a':
  case 'b':
  case 'c':
  case 'd':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
  case 'r':
  case 's':
  case 't':
  case 'u':
  case 'v':
  case 'w':
  case 'x':
  case 'y':
  case 'z':
    lex_ident(lxr);
    return;
  case '|':
    goto switchD_0011d52d_caseD_7c;
  }
  if (lxr->code[lxr->cursor + 1] == '.') {
    (lxr->tk).type = 0x100;
    (lxr->tk).length = 2;
    goto LAB_0011d861;
  }
switchD_0011d52d_caseD_2b:
  if (lxr->code[lxr->cursor + 1] == '=') {
    (lxr->tk).type = 0x101;
    (lxr->tk).length = 2;
  }
  else {
switchD_0011d52d_caseD_2d:
    if (lxr->code[lxr->cursor + 1] == '=') {
      (lxr->tk).type = 0x102;
      (lxr->tk).length = 2;
    }
    else {
switchD_0011d52d_caseD_2a:
      if (lxr->code[lxr->cursor + 1] == '=') {
        (lxr->tk).type = 0x103;
        (lxr->tk).length = 2;
      }
      else {
switchD_0011d52d_caseD_2f:
        if (lxr->code[lxr->cursor + 1] == '=') {
          (lxr->tk).type = 0x104;
          (lxr->tk).length = 2;
        }
        else {
switchD_0011d52d_caseD_25:
          if (lxr->code[lxr->cursor + 1] == '=') {
            (lxr->tk).type = 0x105;
            (lxr->tk).length = 2;
          }
          else {
switchD_0011d52d_caseD_3c:
            if (lxr->code[lxr->cursor + 1] == '=') {
              (lxr->tk).type = 0x108;
              (lxr->tk).length = 2;
            }
            else {
switchD_0011d52d_caseD_3e:
              if (lxr->code[lxr->cursor + 1] == '=') {
                (lxr->tk).type = 0x109;
                (lxr->tk).length = 2;
              }
              else {
switchD_0011d52d_caseD_3d:
                if (lxr->code[lxr->cursor + 1] == '=') {
                  (lxr->tk).type = 0x106;
                  (lxr->tk).length = 2;
                }
                else {
switchD_0011d52d_caseD_21:
                  if (lxr->code[lxr->cursor + 1] == '=') {
                    (lxr->tk).type = 0x107;
                    (lxr->tk).length = 2;
                  }
                  else {
switchD_0011d52d_caseD_26:
                    if (lxr->code[lxr->cursor + 1] == '&') {
                      (lxr->tk).type = 0x10a;
                      (lxr->tk).length = 2;
                    }
                    else {
switchD_0011d52d_caseD_7c:
                      if (lxr->code[lxr->cursor + 1] == '|') {
                        (lxr->tk).type = 0x10b;
                        (lxr->tk).length = 2;
                      }
                      else {
switchD_0011d52d_caseD_1:
                        (lxr->tk).type = (int)lxr->code[lxr->cursor];
                        (lxr->tk).length = 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011d861:
  lxr->cursor = (lxr->tk).length + lxr->cursor;
  return;
}

Assistant:

void lex_next(Lexer *lxr) {
	// Copy across the current line number and start position to the token
	lxr->tk.line = lxr->line;
	lxr->tk.start = lxr->cursor;
	lxr->tk.ident_hash = 0;

	// We use so many case statements in the hope that the compiler is smart
	// enough to convert this switch into a jump table
	switch (lxr->code[lxr->cursor]) {
		// End of file
	case '\0':
		lxr->tk.type = TK_EOF;
		lxr->tk.length = 0;
		return;

		// Whitespace
	case ' ': case '\n': case '\r': case '\t':
		lex_whitespace(lxr);
		lex_next(lxr);
		return;

		// Identifier
	case 'a': case 'b': case 'c': case 'd': case 'e': case 'f': case 'g':
	case 'h': case 'i': case 'j': case 'k': case 'l': case 'm': case 'n':
	case 'o': case 'p': case 'q': case 'r': case 's': case 't': case 'u':
	case 'v': case 'w': case 'x': case 'y': case 'z':
	case 'A': case 'B': case 'C': case 'D': case 'E': case 'F': case 'G':
	case 'H': case 'I': case 'J': case 'K': case 'L': case 'M': case 'N':
	case 'O': case 'P': case 'Q': case 'R': case 'S': case 'T': case 'U':
	case 'V': case 'W': case 'X': case 'Y': case 'Z':
	case '_':
		lex_ident(lxr);
		return;

		// Number
	case '0': case '1': case '2': case '3': case '4': case '5': case '6':
	case '7': case '8': case '9':
		lex_num(lxr);
		return;

		// Multi-character symbols
	MULTI_CHAR_TK('.', '.', TK_CONCAT)

	MULTI_CHAR_TK('+', '=', TK_ADD_ASSIGN)
	MULTI_CHAR_TK('-', '=', TK_SUB_ASSIGN)
	MULTI_CHAR_TK('*', '=', TK_MUL_ASSIGN)
	MULTI_CHAR_TK('/', '=', TK_DIV_ASSIGN)
	MULTI_CHAR_TK('%', '=', TK_MOD_ASSIGN)

	MULTI_CHAR_TK('<', '=', TK_LE)
	MULTI_CHAR_TK('>', '=', TK_GE)
	MULTI_CHAR_TK('=', '=', TK_EQ)
	MULTI_CHAR_TK('!', '=', TK_NEQ)

	MULTI_CHAR_TK('&', '&', TK_AND)
	MULTI_CHAR_TK('|', '|', TK_OR)

		// Single character symbol
	default:
		lxr->tk.type = lxr->code[lxr->cursor];
		lxr->tk.length = 1;
		break;
	}

	// If we reach here, then we haven't updated the cursor position yet
	lxr->cursor += lxr->tk.length;
}